

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkMemUtil.cpp
# Opt level: O0

void __thiscall
vk::SimpleAllocation::SimpleAllocation
          (SimpleAllocation *this,Move<vk::Handle<(vk::HandleType)7>_> *mem,
          MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
          *hostPtr)

{
  PtrData<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  data;
  RefData<vk::Handle<(vk::HandleType)7>_> data_00;
  bool bVar1;
  Handle<(vk::HandleType)7> *pHVar2;
  HostPtr *this_00;
  void *local_90;
  RefData<vk::Handle<(vk::HandleType)7>_> local_48;
  VkDeviceMemory local_28;
  MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  *local_20;
  MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  *hostPtr_local;
  Move<vk::Handle<(vk::HandleType)7>_> *mem_local;
  SimpleAllocation *this_local;
  
  local_20 = hostPtr;
  hostPtr_local =
       (MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
        *)mem;
  mem_local = (Move<vk::Handle<(vk::HandleType)7>_> *)this;
  pHVar2 = refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::operator*
                     (&mem->super_RefBase<vk::Handle<(vk::HandleType)7>_>);
  local_28.m_internal = pHVar2->m_internal;
  bVar1 = de::details::UniqueBase::operator_cast_to_bool((UniqueBase *)hostPtr);
  if (bVar1) {
    this_00 = de::details::
              UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
              ::operator->(&hostPtr->
                            super_UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
                          );
    local_90 = anon_unknown_5::HostPtr::get(this_00);
  }
  else {
    local_90 = (void *)0x0;
  }
  Allocation::Allocation(&this->super_Allocation,local_28,0,local_90);
  (this->super_Allocation)._vptr_Allocation = (_func_int **)&PTR__SimpleAllocation_0168ad08;
  refdetails::Move::operator_cast_to_RefData(&local_48,(Move *)mem);
  data_00.deleter.m_deviceIface = local_48.deleter.m_deviceIface;
  data_00.object.m_internal = local_48.object.m_internal;
  data_00.deleter.m_device = local_48.deleter.m_device;
  data_00.deleter.m_allocator = local_48.deleter.m_allocator;
  refdetails::Unique<vk::Handle<(vk::HandleType)7>_>::Unique(&this->m_memHolder,data_00);
  de::details::MovePtr::operator_cast_to_PtrData
            ((PtrData<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
              *)hostPtr,(MovePtr *)mem);
  data._8_8_ = local_48.deleter.m_deviceIface;
  data.ptr = (HostPtr *)local_48.object.m_internal;
  de::details::
  UniquePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  ::UniquePtr(&this->m_hostPtr,data);
  return;
}

Assistant:

SimpleAllocation::SimpleAllocation (Move<VkDeviceMemory> mem, MovePtr<HostPtr> hostPtr)
	: Allocation	(*mem, (VkDeviceSize)0, hostPtr ? hostPtr->get() : DE_NULL)
	, m_memHolder	(mem)
	, m_hostPtr		(hostPtr)
{
}